

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O3

MPP_RET hal_jpege_vepu2_gen_regs(void *hal,HalEncTask *task)

{
  void *__s;
  RK_U32 RVar1;
  MppFrameFormat fmt;
  MppBuffer pvVar2;
  size_t sVar3;
  JpegeBits *bits;
  RK_U8 *buf;
  int iVar4;
  RK_S32 RVar5;
  MPP_RET MVar6;
  long lVar7;
  uint uVar8;
  RK_U32 RVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  RK_U32 RVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  VepuFormatCfg fmt_cfg;
  uint local_b0;
  uint local_ac;
  int local_a8;
  VepuFormatCfg local_9c;
  uint local_90;
  RK_U32 local_8c;
  size_t local_88;
  MppBuffer local_80;
  ulong local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  HalEncTask *local_58;
  size_t local_50;
  MppBuffer local_48;
  JpegeBits *local_40;
  RK_U8 *local_38;
  
  local_48 = task->input;
  pvVar2 = task->output;
  RVar9 = *(RK_U32 *)((long)hal + 0x40);
  RVar1 = *(RK_U32 *)((long)hal + 0x44);
  fmt = *(MppFrameFormat *)((long)hal + 100);
  local_40 = *(JpegeBits **)((long)hal + 0x10);
  local_70 = *(long *)((long)hal + 0x18);
  local_78 = (ulong)(uint)(*(int *)((long)hal + 0x28) * (task->flags).reg_idx);
  local_58 = task;
  local_50 = mpp_packet_get_length(task->packet);
  local_38 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(pvVar2,"hal_jpege_vepu2_gen_regs");
  local_80 = pvVar2;
  local_88 = mpp_buffer_get_size_with_caller(pvVar2,"hal_jpege_vepu2_gen_regs");
  local_68 = (RK_U8 *)0x0;
  uStack_60 = 0;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p\n","hal_jpege_vepu2_gen_regs",hal);
  }
  if (*(int *)((long)hal + 0x74) != 0) {
    _mpp_log_l(2,"hal_jpege_vepu2","Warning: do not support mirroring\n","hal_jpege_vepu2_gen_regs")
    ;
  }
  uVar8 = RVar9 + 0xf & 0xfffffff0;
  local_ac = RVar1 + 0xf & 0xfffffff0;
  iVar4 = *(int *)((long)hal + 0x70);
  if (iVar4 != 0) {
    RVar13 = RVar1;
    local_b0 = uVar8;
    if (iVar4 == 1) {
      local_a8 = 4;
      goto LAB_00249594;
    }
    if (iVar4 == 3) {
      local_a8 = 8;
      goto LAB_00249594;
    }
    _mpp_log_l(2,"hal_jpege_vepu2",
               "Warning: only support 90 or 270 degree rotate, request rotate %d",
               "hal_jpege_vepu2_gen_regs");
  }
  local_a8 = 0;
  RVar13 = RVar9;
  RVar9 = RVar1;
  local_b0 = local_ac;
  local_ac = uVar8;
LAB_00249594:
  local_8c = get_vepu_pixel_stride
                       ((VepuStrideCfg *)((long)hal + 0x154),RVar13,*(RK_U32 *)((long)hal + 0x48),
                        fmt);
  buf = local_38;
  bits = local_40;
  if ((local_8c & 0xffff8007) != 0) {
    _mpp_log_l(2,"hal_jpege_vepu2",
               "illegal resolution, hor_stride %d, ver_stride %d, width %d, height %d\n",
               "hal_jpege_vepu2_gen_regs",(ulong)*(uint *)((long)hal + 0x48),
               (ulong)*(uint *)((long)hal + 0x4c),*(undefined4 *)((long)hal + 0x40),
               *(undefined4 *)((long)hal + 0x44));
  }
  if (((local_ac - RVar13 < 0x10) ||
      (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"x_fill <= 3",
                  "hal_jpege_vepu2_gen_regs",0x1ac), (mpp_debug._3_1_ & 0x10) == 0)) &&
     ((uVar8 = local_b0 - RVar9, uVar8 < 0x10 ||
      (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"y_fill <= 15",
                  "hal_jpege_vepu2_gen_regs",0x1ad), (mpp_debug._3_1_ & 0x10) == 0)))) {
    __s = (void *)(local_70 + local_78);
    local_90 = local_ac - RVar13 >> 2;
    *(uint *)((long)hal + 0x120) = local_90;
    *(uint *)((long)hal + 0x124) = uVar8;
    mpp_buffer_sync_begin_f(local_80,0,"hal_jpege_vepu2_gen_regs");
    jpege_bits_setup(bits,buf,(RK_S32)local_88);
    jpege_seek_bits(bits,(int)local_50 << 3);
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    uVar17 = 0;
    if (*(int *)(*(long *)((long)hal + 0x38) + 0x94) != 2) {
      hal_jpege_vepu_rc((HalJpegeCtx *)hal,local_58);
      uVar14 = *(undefined4 *)((long)hal + 0x138);
      uVar15 = *(undefined4 *)((long)hal + 0x13c);
      uVar16 = *(undefined4 *)((long)hal + 0x140);
      uVar17 = *(undefined4 *)((long)hal + 0x144);
    }
    local_68 = (RK_U8 *)CONCAT44(uVar15,uVar14);
    uStack_60 = CONCAT44(uVar17,uVar16);
    write_jpeg_header(bits,(JpegeSyntax *)((long)hal + 0x40),(RK_U8 **)&local_68);
    memset(__s,0,0x2e0);
    iVar4 = mpp_buffer_get_fd_with_caller(local_48,"hal_jpege_vepu2_gen_regs");
    *(int *)((long)__s + 0xc0) = iVar4;
    *(int *)((long)__s + 0xc4) = iVar4;
    *(int *)((long)__s + 200) = iVar4;
    RVar5 = jpege_bits_get_bitpos(bits);
    sVar3 = local_88;
    uVar12 = RVar5 + 7;
    RVar9 = (int)uVar12 >> 3;
    *(RK_U8 **)((long)hal + 0x108) = buf;
    *(size_t *)((long)hal + 0x110) = local_88;
    *(RK_S32 *)((long)hal + 0x118) = RVar5;
    *(RK_U32 *)((long)hal + 0x11c) = RVar9;
    get_msb_lsb_at_pos((RK_U32 *)((long)__s + 0xcc),(RK_U32 *)((long)__s + 0xd0),buf,RVar9);
    pvVar2 = local_80;
    mpp_buffer_sync_end_f(local_80,0,"hal_jpege_vepu2_gen_regs");
    *(RK_U32 *)((long)__s + 0xd4) = (int)sVar3 - RVar9;
    *(undefined4 *)((long)__s + 0xd8) = 0x1000;
    *(uint *)((long)__s + 0xf0) = (uVar12 & 0x38) << 0x10 | uVar8 | local_90 << 4;
    *(RK_U32 *)((long)__s + 0xf4) = local_8c;
    iVar4 = mpp_buffer_get_fd_with_caller(pvVar2,"hal_jpege_vepu2_gen_regs");
    *(int *)((long)__s + 0x134) = iVar4;
    if (7 < uVar12) {
      mpp_dev_set_reg_offset(*hal,0x4d,RVar9);
    }
    iVar4 = *(int *)((long)hal + 0xa0);
    uVar14 = 0xb694;
    uVar10 = 0x90900000;
    uVar12 = 0x1d50;
    uVar11 = 0x962b0000;
    uVar8 = 0x4c85;
    if (iVar4 != 0) {
      if (iVar4 == 2) {
        uVar8 = *(uint *)((long)hal + 0xa4);
        uVar12 = *(uint *)((long)hal + 0xac);
        uVar14 = *(undefined4 *)((long)hal + 0xb4);
        uVar11 = *(int *)((long)hal + 0xa8) << 0x10;
        uVar10 = *(int *)((long)hal + 0xb0) << 0x10;
      }
      else if (iVar4 == 1) {
        uVar14 = 0xa28f;
        uVar10 = 0x89f50000;
        uVar12 = 0x127c;
        uVar11 = 0xb7170000;
        uVar8 = 0x366d;
      }
      else {
        _mpp_log_l(2,"hal_jpege_vepu2","invalid color conversion type %d\n",(char *)0x0);
        uVar14 = 0xb694;
      }
    }
    *(uint *)((long)__s + 0x17c) = uVar8 | uVar11;
    *(uint *)((long)__s + 0x180) = uVar12 | uVar10;
    *(undefined4 *)((long)__s + 0x184) = uVar14;
    *(uint *)((long)__s + 0x19c) = local_b0 << 0x10 | local_ac << 4 | 0x61;
    MVar6 = get_vepu_fmt(&local_9c,fmt);
    if (MVar6 == MPP_OK) {
      *(VepuFmt *)((long)__s + 0x128) = local_9c.format * 0x10 + local_a8;
      *(uint *)((long)__s + 0x188) =
           local_9c.r_mask & 0x1f | (local_9c.g_mask & 0x1f) << 8 | (local_9c.b_mask & 0x1f) << 0x10
      ;
      *(uint *)((long)__s + 0x1a4) =
           (uint)local_9c.swap_8_in * -0x80000000 +
           ((local_9c.swap_16_in & 1) << 0x1e | (local_9c.swap_32_in & 1) << 0x1d) + 0x1c000000;
    }
    uVar8 = (uint)jpege_restart_marker[*(uint *)((long)hal + 0x128) & 7] |
            (*(uint *)((long)hal + 0xdc) & 0xff) << 0x10;
    *(uint *)((long)__s + 0x1ac) = uVar8;
    *(undefined4 *)((long)__s + 0x1b4) = 0x1400;
    if (*(int *)((long)hal + 0xd8) != 0) {
      *(uint *)((long)__s + 0x1ac) = uVar8 | 0x1000000;
      *(undefined4 *)((long)__s + 0x1b4) = 0x11400;
    }
    lVar7 = 0;
    do {
      *(uint *)((long)__s + lVar7) =
           (uint)local_68[qp_reorder_table[lVar7 + 3]] |
           (uint)local_68[qp_reorder_table[lVar7 + 2]] << 8 |
           (uint)local_68[qp_reorder_table[lVar7 + 1]] << 0x10 |
           (uint)local_68[qp_reorder_table[lVar7]] << 0x18;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    lVar7 = 0;
    do {
      *(uint *)(local_70 + local_78 + 0x40 + lVar7) =
           (uint)*(byte *)(uStack_60 + (ulong)qp_reorder_table[lVar7 + 3]) |
           (uint)*(byte *)(uStack_60 + (ulong)qp_reorder_table[lVar7 + 2]) << 8 |
           (uint)*(byte *)(uStack_60 + (ulong)qp_reorder_table[lVar7 + 1]) << 0x10 |
           (uint)*(byte *)(uStack_60 + (ulong)qp_reorder_table[lVar7]) << 0x18;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    if (((byte)hal_jpege_debug & 1) != 0) {
      _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_gen_regs",hal);
    }
    return MPP_OK;
  }
  abort();
}

Assistant:

MPP_RET hal_jpege_vepu2_gen_regs(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    MppBuffer input  = task->input;
    MppBuffer output = task->output;
    JpegeSyntax *syntax = &ctx->syntax;
    RK_U32 width        = syntax->width;
    RK_U32 width_align  = MPP_ALIGN(width, 16);
    RK_U32 height       = syntax->height;
    MppFrameFormat fmt  = syntax->format;
    RK_U32 hor_stride   = 0;
    RK_U32 ver_stride   = MPP_ALIGN(height, 16);
    JpegeBits bits      = ctx->bits;
    RK_S32 reg_idx      = task->flags.reg_idx;
    RK_U32 *regs = (RK_U32 *)((RK_U8 *)ctx->regs + ctx->reg_size * reg_idx);
    size_t length = mpp_packet_get_length(task->packet);
    RK_U8  *buf = mpp_buffer_get_ptr(output);
    size_t size = mpp_buffer_get_size(output);
    const RK_U8 *qtable[2] = {NULL};
    RK_S32 bitpos;
    RK_S32 bytepos;
    RK_U32 x_fill = 0;
    RK_U32 y_fill = 0;
    VepuFormatCfg fmt_cfg;
    RK_U32 rotation = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    // do not support mirroring
    if (syntax->mirroring)
        mpp_err_f("Warning: do not support mirroring\n");

    if (syntax->rotation == MPP_ENC_ROT_90)
        rotation = 1;
    else if (syntax->rotation == MPP_ENC_ROT_270)
        rotation = 2;
    else if (syntax->rotation != MPP_ENC_ROT_0)
        mpp_err_f("Warning: only support 90 or 270 degree rotate, request rotate %d", syntax->rotation);
    if (rotation) {
        MPP_SWAP(RK_U32, width, height);
        MPP_SWAP(RK_U32, width_align, ver_stride);
    }
    hor_stride = get_vepu_pixel_stride(&ctx->stride_cfg, width,
                                       syntax->hor_stride, fmt);

    //hor_stride must be align with 8, and ver_stride mus align with 2
    if ((hor_stride & 0x7) || (ver_stride & 0x1) || (hor_stride >= (1 << 15))) {
        mpp_err_f("illegal resolution, hor_stride %d, ver_stride %d, width %d, height %d\n",
                  syntax->hor_stride, syntax->ver_stride,
                  syntax->width, syntax->height);
    }

    x_fill = (width_align - width) / 4;
    y_fill = (ver_stride - height);
    mpp_assert(x_fill <= 3);
    mpp_assert(y_fill <= 15);
    ctx->part_x_fill = x_fill;
    ctx->part_y_fill = y_fill;

    mpp_buffer_sync_begin(output);

    /* write header to output buffer */
    jpege_bits_setup(bits, buf, (RK_U32)size);
    /* seek length bytes data */
    jpege_seek_bits(bits, length << 3);
    /* NOTE: write header will update qtable */
    if (ctx->cfg->rc.rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        hal_jpege_vepu_rc(ctx, task);
        qtable[0] = ctx->hal_rc.qtable_y;
        qtable[1] = ctx->hal_rc.qtable_c;
    } else {
        qtable[0] = NULL;
        qtable[1] = NULL;
    }
    write_jpeg_header(bits, syntax, qtable);

    memset(regs, 0, sizeof(RK_U32) * VEPU_JPEGE_VEPU2_NUM_REGS);
    // input address setup
    regs[VEPU2_REG_INPUT_Y] = mpp_buffer_get_fd(input);
    regs[VEPU2_REG_INPUT_U] = regs[VEPU2_REG_INPUT_Y];
    regs[VEPU2_REG_INPUT_V] = regs[VEPU2_REG_INPUT_Y];

    // output address setup
    bitpos = jpege_bits_get_bitpos(bits);
    bytepos = (bitpos + 7) >> 3;
    ctx->base = buf;
    ctx->size = size;
    ctx->sw_bit = bitpos;
    ctx->part_bytepos = bytepos;

    get_msb_lsb_at_pos(&regs[51], &regs[52], buf, bytepos);

    mpp_buffer_sync_end(output);

    regs[53] = size - bytepos;

    // bus config
    regs[54] = 16 << 8;

    regs[60] = (((bytepos & 7) * 8) << 16) |
               (x_fill << 4) |
               (y_fill);
    regs[61] = hor_stride;

    regs[77] = mpp_buffer_get_fd(output);
    if (bytepos)
        mpp_dev_set_reg_offset(ctx->dev, 77, bytepos);
    /* 95 - 97 color conversion parameter */
    {
        RK_U32 coeffA;
        RK_U32 coeffB;
        RK_U32 coeffC;
        RK_U32 coeffE;
        RK_U32 coeffF;

        switch (syntax->color_conversion_type) {
        case 0 : {  /* BT.601 */
            /*
             * Y  = 0.2989 R + 0.5866 G + 0.1145 B
             * Cb = 0.5647 (B - Y) + 128
             * Cr = 0.7132 (R - Y) + 128
             */
            coeffA = 19589;
            coeffB = 38443;
            coeffC = 7504;
            coeffE = 37008;
            coeffF = 46740;
        } break;
        case 1 : {  /* BT.709 */
            /*
             * Y  = 0.2126 R + 0.7152 G + 0.0722 B
             * Cb = 0.5389 (B - Y) + 128
             * Cr = 0.6350 (R - Y) + 128
             */
            coeffA = 13933;
            coeffB = 46871;
            coeffC = 4732;
            coeffE = 35317;
            coeffF = 41615;
        } break;
        case 2 : {
            coeffA = syntax->coeffA;
            coeffB = syntax->coeffB;
            coeffC = syntax->coeffC;
            coeffE = syntax->coeffE;
            coeffF = syntax->coeffF;
        } break;
        default : {
            mpp_err("invalid color conversion type %d\n",
                    syntax->color_conversion_type);
            coeffA = 19589;
            coeffB = 38443;
            coeffC = 7504;
            coeffE = 37008;
            coeffF = 46740;
        } break;
        }

        regs[95] = coeffA | (coeffB << 16);
        regs[96] = coeffC | (coeffE << 16);
        regs[97] = coeffF;
    }

    regs[103] = (width_align >> 4) << 8  |
                (ver_stride >> 4) << 20 |
                (1 << 6) |  /* intra coding  */
                (2 << 4) |  /* format jpeg   */
                1;          /* encoder start */

    if (!get_vepu_fmt(&fmt_cfg, fmt)) {
        regs[74] = (fmt_cfg.format << 4) |
                   (rotation << 2);
        regs[98] = (fmt_cfg.b_mask & 0x1f) << 16 |
                   (fmt_cfg.g_mask & 0x1f) << 8  |
                   (fmt_cfg.r_mask & 0x1f);
        regs[105] = 7 << 26 | (fmt_cfg.swap_32_in & 1) << 29 |
                    (fmt_cfg.swap_16_in & 1) << 30 |
                    (fmt_cfg.swap_8_in & 1) << 31;
    }

    regs[107] = ((syntax->part_rows & 0xff) << 16) |
                jpege_restart_marker[ctx->rst_marker_idx & 7];

    /* encoder interrupt */
    regs[109] = 1 << 12 |   /* clock gating */
                1 << 10;    /* enable timeout interrupt */

    if (syntax->low_delay) {
        /* slice encode end by RST */
        regs[107] |= (1 << 24);
        /* slice interrupt enable */
        regs[109] |= (1 << 16);
    }

    /* 0 ~ 31 quantization tables */
    {
        RK_S32 i;

        for (i = 0; i < 16; i++) {
            /* qtable need to reorder in particular order */
            regs[i] = qtable[0][qp_reorder_table[i * 4 + 0]] << 24 |
                      qtable[0][qp_reorder_table[i * 4 + 1]] << 16 |
                      qtable[0][qp_reorder_table[i * 4 + 2]] << 8 |
                      qtable[0][qp_reorder_table[i * 4 + 3]];
        }
        for (i = 0; i < 16; i++) {
            /* qtable need to reorder in particular order */
            regs[i + 16] = qtable[1][qp_reorder_table[i * 4 + 0]] << 24 |
                           qtable[1][qp_reorder_table[i * 4 + 1]] << 16 |
                           qtable[1][qp_reorder_table[i * 4 + 2]] << 8 |
                           qtable[1][qp_reorder_table[i * 4 + 3]];
        }
    }

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}